

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void write_io(Emulator *e,MaskedAddress addr,u8 value)

{
  EmulatorEvent *pEVar1;
  SGB *pSVar2;
  ushort uVar3;
  undefined2 uVar4;
  PPUMode PVar5;
  DmaState DVar6;
  TimaState TVar7;
  SGB *pSVar8;
  EmulatorState *pEVar9;
  u8 info;
  byte bVar10;
  Address AVar11;
  JoypadSelect JVar12;
  RGBA RVar13;
  Bool BVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  SgbMask SVar18;
  byte bVar19;
  byte bVar20;
  SgbState SVar21;
  byte bVar22;
  Bool BVar23;
  size_t __n;
  ulong uVar24;
  ColorPalettes *pCVar25;
  int y;
  long lVar26;
  long lVar27;
  uint uVar28;
  int x0;
  undefined6 in_register_00000032;
  bool bVar29;
  byte bVar30;
  uint uVar31;
  u8 *puVar32;
  ulong uVar33;
  long lVar34;
  RGBA *pRVar35;
  RGBA *pRVar36;
  int x;
  PaletteType type;
  int iVar37;
  long lVar38;
  bool bVar39;
  bool bVar40;
  u8 *local_78;
  RGBA *local_40;
  
  iVar37 = (int)CONCAT62(in_register_00000032,addr);
  switch(iVar37) {
  case 0x40:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    BVar14 = (e->state).ppu.lcdc.display;
    (e->state).ppu.lcdc.display = (uint)(value >> 7);
    (e->state).ppu.lcdc.window_tile_map_select = value >> 6 & TILE_MAP_9C00_9FFF;
    (e->state).ppu.lcdc.window_display = value >> 5 & TRUE;
    (e->state).ppu.lcdc.bg_tile_data_select = value >> 4 & TILE_DATA_8000_8FFF;
    (e->state).ppu.lcdc.bg_tile_map_select = value >> 3 & TILE_MAP_9C00_9FFF;
    (e->state).ppu.lcdc.obj_size = value >> 2 & OBJ_SIZE_8X16;
    (e->state).ppu.lcdc.obj_display = value >> 1 & TRUE;
    (e->state).ppu.lcdc.bg_display = value & TRUE;
    if (BVar14 == value >> 7) {
      return;
    }
    (e->state).ppu.stat.mode = PPU_MODE_HBLANK;
    (e->state).ppu.line_y = '\0';
    (e->state).ppu.ly = '\0';
    if ((char)value < '\0') {
      check_ly_eq_lyc(e,FALSE);
      (e->state).ppu.state = PPU_STATE_LCD_ON_MODE2;
      (e->state).ppu.state_ticks = 0x50;
      (e->state).ppu.line_start_ticks = (e->state).ticks - 5 & 0xfffffffffffffffc;
      (e->state).ppu.display_delay_frames = '\x04';
      (e->state).ppu.stat.trigger_mode = PPU_MODE_MODE2;
    }
    else {
      if ((e->state).is_sgb == FALSE) {
        clear_frame_buffer(e,0xffffffff);
      }
      else {
        update_sgb_mask(e);
      }
      pEVar1 = &(e->state).event;
      *(byte *)pEVar1 = (byte)*pEVar1 | 1;
    }
    goto LAB_0010671d;
  case 0x41:
    ppu_synchronize(e);
    BVar14 = value >> 4 & TRUE;
    BVar23 = value >> 3 & TRUE;
    if ((e->state).ppu.lcdc.display != FALSE) {
      PVar5 = (e->state).ppu.stat.trigger_mode;
      if (PVar5 == PPU_MODE_VBLANK) {
        bVar29 = (e->state).ppu.stat.vblank.irq == FALSE;
        bVar39 = false;
      }
      else {
        if (PVar5 == PPU_MODE_HBLANK) {
          bVar39 = (e->state).ppu.stat.hblank.irq == FALSE;
        }
        else {
          bVar39 = false;
        }
        bVar29 = false;
      }
      if ((e->state).ppu.stat.new_ly_eq_lyc == FALSE) {
        bVar40 = false;
      }
      else {
        bVar40 = (e->state).ppu.stat.y_compare.irq == FALSE;
      }
      if ((e->state).is_cgb != FALSE) {
        bVar39 = (bool)(bVar39 & (byte)BVar23);
        bVar29 = (bool)(bVar29 & (byte)BVar14);
      }
      if (((e->state).ppu.stat.if_ == FALSE) && ((bVar39 != false || bVar29 != false) || bVar40)) {
        puVar32 = &(e->state).interrupt.new_if;
        *puVar32 = *puVar32 | 2;
        puVar32 = &(e->state).interrupt.if_;
        *puVar32 = *puVar32 | 2;
        (e->state).ppu.stat.if_ = TRUE;
      }
    }
    (e->state).ppu.stat.y_compare.irq = value >> 6 & TRUE;
    (e->state).ppu.stat.mode2.irq = value >> 5 & TRUE;
    (e->state).ppu.stat.vblank.irq = BVar14;
    (e->state).ppu.stat.hblank.irq = BVar23;
    goto LAB_0010671d;
  case 0x42:
    ppu_mode3_synchronize(e);
    (e->state).ppu.scy = value;
    break;
  case 0x43:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    (e->state).ppu.scx = value;
    break;
  case 0x44:
  case 0x4c:
  case 0x4e:
  case 0x50:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
    break;
  case 0x45:
    ppu_synchronize(e);
    (e->state).ppu.lyc = value;
    if ((e->state).ppu.lcdc.display != FALSE) {
      check_ly_eq_lyc(e,TRUE);
      check_stat(e);
    }
LAB_0010671d:
    calculate_next_ppu_intr(e);
    return;
  case 0x46:
    dma_synchronize(e);
    (e->state).dma.sync_ticks = (e->state).ticks;
    (e->state).dma.tick_count = 0;
    DVar6 = (e->state).dma.state;
    (e->state).dma.state = DVar6 + (DVar6 == DMA_INACTIVE);
    (e->state).dma.source = (ushort)value << 8;
    break;
  case 0x47:
  case 0x48:
  case 0x49:
    type = addr - 0x47;
    ppu_mode3_synchronize(e);
    (e->state).ppu.pal[type].color[3] = (uint)(value >> 6);
    (e->state).ppu.pal[type].color[2] = value >> 4 & COLOR_BLACK;
    (e->state).ppu.pal[type].color[1] = value >> 2 & COLOR_BLACK;
    (e->state).ppu.pal[type].color[0] = value & COLOR_BLACK;
    update_bw_palette_rgba(e,type);
    return;
  case 0x4a:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    (e->state).ppu.wy = value;
    break;
  case 0x4b:
    ppu_mode3_synchronize(e);
    (e->state).ppu.wx = value;
    break;
  case 0x4d:
    if ((e->state).is_cgb != FALSE) {
      (e->state).cpu_speed.switching = (uint)(value & 1);
    }
    break;
  case 0x4f:
    if ((e->state).is_cgb != FALSE) {
      (e->state).vram.bank = value & 1;
      (e->state).vram.offset = (ushort)(value & 1) << 0xd;
    }
    break;
  case 0x51:
    if ((e->state).is_cgb != FALSE) {
      *(u8 *)((long)&(e->state).hdma.source + 1) = value;
    }
    break;
  case 0x52:
    if ((e->state).is_cgb != FALSE) {
      *(byte *)&(e->state).hdma.source = value & 0xf0;
    }
    break;
  case 0x53:
    if ((e->state).is_cgb != FALSE) {
      *(u8 *)((long)&(e->state).hdma.dest + 1) = value;
    }
    break;
  case 0x54:
    if ((e->state).is_cgb != FALSE) {
      *(byte *)&(e->state).hdma.dest = value & 0xf0;
    }
    break;
  case 0x55:
    if ((e->state).is_cgb != FALSE) {
      if (((e->state).hdma.mode == HDMA_TRANSFER_MODE_HDMA) &&
         (bVar10 = (e->state).hdma.blocks, -1 < (char)bVar10)) {
        if ((char)value < '\0') {
          (e->state).hdma.blocks = value & 0x7f;
          (e->state).hdma.mode = HDMA_TRANSFER_MODE_HDMA;
        }
        else {
          (e->state).hdma.blocks = bVar10 | value | 0x80;
        }
      }
      else {
        (e->state).hdma.mode = (uint)(value >> 7);
        (e->state).hdma.blocks = value & 0x7f;
        if (-1 < (char)value) {
          (e->state).hdma.state = DMA_ACTIVE;
        }
      }
    }
    break;
  case 0x56:
    if ((e->state).is_cgb != FALSE) {
      (e->state).infrared.write = value & TRUE;
      (e->state).infrared.enabled = (uint)(value >> 6);
    }
    break;
  case 0x68:
  case 0x6a:
    if ((e->state).is_cgb != FALSE) {
      ppu_mode3_synchronize(e);
      pCVar25 = &(e->state).ppu.bgcp;
      if (addr != 0x68) {
        pCVar25 = &(e->state).ppu.obcp;
      }
      pCVar25->index = value & 0x3f;
      pCVar25->auto_increment = (uint)(value >> 7);
    }
    break;
  case 0x69:
  case 0x6b:
    if ((e->state).is_cgb != FALSE) {
      ppu_mode3_synchronize(e);
      pCVar25 = &(e->state).ppu.obcp;
      if (addr == 0x69) {
        pCVar25 = &(e->state).ppu.bgcp;
      }
      pCVar25->data[pCVar25->index] = value;
      bVar10 = pCVar25->index;
      RVar13 = unpack_cgb_color(e,CONCAT11(pCVar25->data[(ulong)bVar10 | 1],
                                           pCVar25->data[bVar10 & 0xfffffffe]));
      *(RGBA *)((long)pCVar25->palettes[0].color +
               (ulong)((uint)bVar10 + (uint)bVar10 & 0xc) +
               (ulong)((uint)bVar10 + (uint)bVar10 & 0x70)) = RVar13;
      if (pCVar25->auto_increment != FALSE) {
        pCVar25->index = bVar10 + 1 & 0x3f;
      }
    }
    break;
  case 0x70:
    if ((e->state).is_cgb != FALSE) {
      (e->state).wram.bank = value & 7;
      AVar11 = 0x1000;
      if ((value & 7) != 0) {
        AVar11 = (ushort)(value & 7) << 0xc;
      }
      (e->state).wram.offset = AVar11;
    }
    break;
  default:
    switch(CONCAT62(in_register_00000032,addr) & 0xffffffff) {
    case 0:
      bVar10 = value >> 4 & 3;
      JVar12 = value >> 4 & JOYPAD_SELECT_NONE;
      (e->state).joyp.joypad_select = JVar12;
      if ((e->state).is_sgb == FALSE) goto switchD_00106952_caseD_8;
      switch((e->state).sgb.state) {
      case SGB_STATE_IDLE:
        if (bVar10 != 0) break;
        (e->state).sgb.bits_read = '\0';
        bVar10 = (e->state).sgb.current_packet + 1;
        (e->state).sgb.current_packet = bVar10;
        if ((e->state).sgb.packet_count <= bVar10) {
          (e->state).sgb.current_packet = '\0';
          (e->state).sgb.packet_count = '\0';
          (e->state).sgb.data[0] = '\0';
          (e->state).sgb.data[1] = '\0';
          (e->state).sgb.data[2] = '\0';
          (e->state).sgb.data[3] = '\0';
          (e->state).sgb.data[4] = '\0';
          (e->state).sgb.data[5] = '\0';
          (e->state).sgb.data[6] = '\0';
          (e->state).sgb.data[7] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[8] = '\0';
          (pEVar9->sgb).data[9] = '\0';
          (pEVar9->sgb).data[10] = '\0';
          (pEVar9->sgb).data[0xb] = '\0';
          (pEVar9->sgb).data[0xc] = '\0';
          (pEVar9->sgb).data[0xd] = '\0';
          (pEVar9->sgb).data[0xe] = '\0';
          (pEVar9->sgb).data[0xf] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x10] = '\0';
          (pEVar9->sgb).data[0x11] = '\0';
          (pEVar9->sgb).data[0x12] = '\0';
          (pEVar9->sgb).data[0x13] = '\0';
          (pEVar9->sgb).data[0x14] = '\0';
          (pEVar9->sgb).data[0x15] = '\0';
          (pEVar9->sgb).data[0x16] = '\0';
          (pEVar9->sgb).data[0x17] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x18] = '\0';
          (pEVar9->sgb).data[0x19] = '\0';
          (pEVar9->sgb).data[0x1a] = '\0';
          (pEVar9->sgb).data[0x1b] = '\0';
          (pEVar9->sgb).data[0x1c] = '\0';
          (pEVar9->sgb).data[0x1d] = '\0';
          (pEVar9->sgb).data[0x1e] = '\0';
          (pEVar9->sgb).data[0x1f] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x20] = '\0';
          (pEVar9->sgb).data[0x21] = '\0';
          (pEVar9->sgb).data[0x22] = '\0';
          (pEVar9->sgb).data[0x23] = '\0';
          (pEVar9->sgb).data[0x24] = '\0';
          (pEVar9->sgb).data[0x25] = '\0';
          (pEVar9->sgb).data[0x26] = '\0';
          (pEVar9->sgb).data[0x27] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x28] = '\0';
          (pEVar9->sgb).data[0x29] = '\0';
          (pEVar9->sgb).data[0x2a] = '\0';
          (pEVar9->sgb).data[0x2b] = '\0';
          (pEVar9->sgb).data[0x2c] = '\0';
          (pEVar9->sgb).data[0x2d] = '\0';
          (pEVar9->sgb).data[0x2e] = '\0';
          (pEVar9->sgb).data[0x2f] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x30] = '\0';
          (pEVar9->sgb).data[0x31] = '\0';
          (pEVar9->sgb).data[0x32] = '\0';
          (pEVar9->sgb).data[0x33] = '\0';
          (pEVar9->sgb).data[0x34] = '\0';
          (pEVar9->sgb).data[0x35] = '\0';
          (pEVar9->sgb).data[0x36] = '\0';
          (pEVar9->sgb).data[0x37] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x38] = '\0';
          (pEVar9->sgb).data[0x39] = '\0';
          (pEVar9->sgb).data[0x3a] = '\0';
          (pEVar9->sgb).data[0x3b] = '\0';
          (pEVar9->sgb).data[0x3c] = '\0';
          (pEVar9->sgb).data[0x3d] = '\0';
          (pEVar9->sgb).data[0x3e] = '\0';
          (pEVar9->sgb).data[0x3f] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x40] = '\0';
          (pEVar9->sgb).data[0x41] = '\0';
          (pEVar9->sgb).data[0x42] = '\0';
          (pEVar9->sgb).data[0x43] = '\0';
          (pEVar9->sgb).data[0x44] = '\0';
          (pEVar9->sgb).data[0x45] = '\0';
          (pEVar9->sgb).data[0x46] = '\0';
          (pEVar9->sgb).data[0x47] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x48] = '\0';
          (pEVar9->sgb).data[0x49] = '\0';
          (pEVar9->sgb).data[0x4a] = '\0';
          (pEVar9->sgb).data[0x4b] = '\0';
          (pEVar9->sgb).data[0x4c] = '\0';
          (pEVar9->sgb).data[0x4d] = '\0';
          (pEVar9->sgb).data[0x4e] = '\0';
          (pEVar9->sgb).data[0x4f] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x50] = '\0';
          (pEVar9->sgb).data[0x51] = '\0';
          (pEVar9->sgb).data[0x52] = '\0';
          (pEVar9->sgb).data[0x53] = '\0';
          (pEVar9->sgb).data[0x54] = '\0';
          (pEVar9->sgb).data[0x55] = '\0';
          (pEVar9->sgb).data[0x56] = '\0';
          (pEVar9->sgb).data[0x57] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x58] = '\0';
          (pEVar9->sgb).data[0x59] = '\0';
          (pEVar9->sgb).data[0x5a] = '\0';
          (pEVar9->sgb).data[0x5b] = '\0';
          (pEVar9->sgb).data[0x5c] = '\0';
          (pEVar9->sgb).data[0x5d] = '\0';
          (pEVar9->sgb).data[0x5e] = '\0';
          (pEVar9->sgb).data[0x5f] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x60] = '\0';
          (pEVar9->sgb).data[0x61] = '\0';
          (pEVar9->sgb).data[0x62] = '\0';
          (pEVar9->sgb).data[99] = '\0';
          (pEVar9->sgb).data[100] = '\0';
          (pEVar9->sgb).data[0x65] = '\0';
          (pEVar9->sgb).data[0x66] = '\0';
          (pEVar9->sgb).data[0x67] = '\0';
          pEVar9 = &e->state;
          (pEVar9->sgb).data[0x68] = '\0';
          (pEVar9->sgb).data[0x69] = '\0';
          (pEVar9->sgb).data[0x6a] = '\0';
          (pEVar9->sgb).data[0x6b] = '\0';
          (pEVar9->sgb).data[0x6c] = '\0';
          (pEVar9->sgb).data[0x6d] = '\0';
          (pEVar9->sgb).data[0x6e] = '\0';
          (pEVar9->sgb).data[0x6f] = '\0';
        }
LAB_00106783:
        (e->state).sgb.state = SGB_STATE_WAIT_BIT;
        goto LAB_001067d0;
      case SGB_STATE_WAIT_BIT:
        if (bVar10 != 3) goto LAB_001067c3;
        SVar21 = (e->state).sgb.bits_read >> 7 | SGB_STATE_READ_BIT;
        bVar39 = true;
LAB_001067bb:
        (e->state).sgb.state = SVar21;
        goto LAB_001067f8;
      case SGB_STATE_READ_BIT:
        if (bVar10 == 2) {
          puVar32 = &(e->state).sgb.bits_read;
          *puVar32 = *puVar32 + '\x01';
          (e->state).sgb.state = SGB_STATE_WAIT_BIT;
          goto switchD_00106952_caseD_8;
        }
        if (JVar12 == JOYPAD_SELECT_BUTTONS) {
          bVar10 = (e->state).sgb.bits_read;
          puVar32 = (e->state).sgb.data +
                    ((uint)(bVar10 >> 3) | (uint)(e->state).sgb.current_packet << 4);
          *puVar32 = *puVar32 | '\x01' << (bVar10 & 7);
          puVar32 = &(e->state).sgb.bits_read;
          *puVar32 = *puVar32 + '\x01';
          goto LAB_00106783;
        }
        break;
      case SGB_STATE_STOP_BIT:
        if (bVar10 == 2) {
          (e->state).sgb.state = SGB_STATE_STOP_WAIT;
          goto switchD_00106952_caseD_8;
        }
LAB_001067c3:
        (e->state).sgb.state = SGB_STATE_IDLE;
        break;
      case SGB_STATE_STOP_WAIT:
        SVar21 = SGB_STATE_IDLE;
        bVar39 = false;
        if (bVar10 == 3) goto LAB_001067bb;
      }
      if (bVar10 < 2) {
LAB_001067d0:
        if ((e->state).sgb.player_incremented == FALSE) {
          (e->state).sgb.player_incremented = TRUE;
        }
        goto switchD_00106952_caseD_8;
      }
      bVar39 = true;
      if (bVar10 != 3) goto switchD_00106952_caseD_8;
LAB_001067f8:
      if ((e->state).sgb.player_incremented != FALSE) {
        (e->state).sgb.current_player =
             (e->state).sgb.current_player + 1 & (e->state).sgb.player_mask;
      }
      (e->state).sgb.player_incremented = FALSE;
      if (bVar39) goto switchD_00106952_caseD_8;
      bVar10 = (e->state).sgb.current_packet;
      if (bVar10 == 0) {
        bVar19 = (e->state).sgb.data[0] & 7;
        (e->state).sgb.packet_count = bVar19;
      }
      else {
        bVar19 = (e->state).sgb.packet_count;
      }
      if (bVar19 - 1 != (uint)bVar10) goto switchD_00106952_caseD_8;
      bVar10 = (e->state).sgb.data[0] >> 3;
      uVar24 = (ulong)(uint)bVar10;
      local_78 = (u8 *)0x0;
      if ((bVar10 < 0x16) && ((0x380800U >> (uint)bVar10 & 1) != 0)) {
        bVar19 = (e->state).vram.data
                 [(ulong)((e->state).ppu.lcdc.bg_tile_map_select != TILE_MAP_9800_9BFF) * 0x400 +
                  0x1800];
        if ((e->state).ppu.lcdc.bg_tile_data_select == TILE_DATA_8800_97FF) {
          uVar31 = (char)bVar19 * -0x10 + 0x800U & 0xffff;
          memcpy(do_sgb_s_temp_xfer_buffer,
                 (e->state).vram.data + ((char)bVar19 * 0x10 + 0x1000U & 0xffff),(ulong)uVar31);
          local_78 = do_sgb_s_temp_xfer_buffer;
          memcpy(do_sgb_s_temp_xfer_buffer + uVar31,(e->state).vram.data + 0x800,
                 (ulong)(0x1000 - uVar31));
        }
        else {
          local_78 = (e->state).vram.data + (ulong)bVar19 * 0x10;
        }
      }
      if (0x17 < bVar10) goto switchD_00106952_caseD_8;
      pSVar2 = &(e->state).sgb;
      switch(uVar24) {
      case 0:
      case 1:
      case 2:
      case 3:
        iVar37 = *(int *)(do_sgb_s_pals + uVar24 * 8 + 4);
        set_sgb_palette(e,*(int *)(do_sgb_s_pals + uVar24 * 8),(e->state).sgb.data[1],
                        (e->state).sgb.data[2],(e->state).sgb.data[3],(e->state).sgb.data[4],
                        (e->state).sgb.data[5],(e->state).sgb.data[6],(e->state).sgb.data[7],
                        (e->state).sgb.data[8]);
        set_sgb_palette(e,iVar37,(e->state).sgb.data[1],(e->state).sgb.data[2],
                        (e->state).sgb.data[9],(e->state).sgb.data[10],(e->state).sgb.data[0xb],
                        (e->state).sgb.data[0xc],(e->state).sgb.data[0xd],(e->state).sgb.data[0xe]);
        break;
      case 4:
        uVar15 = (int)(short)((ushort)(e->state).sgb.packet_count * 0x10 + -2) / 6 & 0xffff;
        uVar31 = (uint)(e->state).sgb.data[1];
        if (uVar15 < uVar31) {
          uVar31 = uVar15;
        }
        for (lVar34 = 0; (ulong)uVar31 * 6 != lVar34; lVar34 = lVar34 + 6) {
          bVar10 = (e->state).sgb.data[lVar34 + 2];
          bVar19 = (e->state).sgb.data[lVar34 + 3];
          bVar20 = (e->state).sgb.data[lVar34 + 4];
          uVar15 = (uint)(e->state).sgb.data[lVar34 + 5];
          uVar16 = (uint)(e->state).sgb.data[lVar34 + 6];
          uVar17 = (uint)(e->state).sgb.data[lVar34 + 7];
          if ((bVar10 & 1) != 0) {
            set_sgb_attr_block(e,(uint)bVar20,uVar15,uVar16,uVar17,bVar19 & 3);
          }
          if ((bVar10 & 2) != 0) {
            bVar30 = bVar19 >> 2 & 3;
            set_sgb_attr_block(e,(uint)bVar20,uVar15,uVar16,uVar15,bVar30);
            set_sgb_attr_block(e,(uint)bVar20,uVar15,(uint)bVar20,uVar17,bVar30);
            set_sgb_attr_block(e,(uint)bVar20,uVar17,uVar16,uVar17,bVar30);
            set_sgb_attr_block(e,uVar16,uVar15,uVar16,uVar17,bVar30);
          }
          if ((bVar10 & 4) != 0) {
            bVar10 = bVar19 >> 4 & 3;
            set_sgb_attr_block(e,0,0,0x13,uVar15 - 1,bVar10);
            set_sgb_attr_block(e,0,uVar15,bVar20 - 1,uVar17,bVar10);
            set_sgb_attr_block(e,0,uVar17 + 1,0x13,0x11,bVar10);
            set_sgb_attr_block(e,uVar16 + 1,uVar15,0x13,uVar17,bVar10);
          }
        }
        break;
      case 5:
        bVar10 = (e->state).sgb.data[1];
        uVar31 = (uint)(e->state).sgb.packet_count * 0x10 - 2;
        if ((int)(uint)bVar10 <= (int)uVar31) {
          uVar31 = (uint)bVar10;
        }
        uVar33 = 0;
        uVar24 = (ulong)uVar31;
        if ((int)uVar31 < 1) {
          uVar24 = uVar33;
        }
        for (; uVar24 != uVar33; uVar33 = uVar33 + 1) {
          bVar10 = (e->state).sgb.data[uVar33 + 2];
          uVar31 = bVar10 & 0x1f;
          if ((char)bVar10 < '\0') {
            uVar28 = 0;
            uVar16 = 0x13;
            uVar15 = uVar31;
            uVar17 = uVar31;
          }
          else {
            uVar15 = 0x11;
            uVar16 = uVar31;
            uVar17 = 0;
            uVar28 = uVar31;
          }
          set_sgb_attr_block(e,uVar28,uVar17,uVar16,uVar15,bVar10 >> 5 & 3);
        }
        break;
      case 6:
        bVar10 = (e->state).sgb.data[1];
        bVar30 = bVar10 >> 2 & 3;
        bVar20 = bVar10 >> 4 & 3;
        bVar19 = (e->state).sgb.data[2];
        uVar31 = (uint)bVar19;
        iVar37 = bVar19 + 1;
        if ((bVar10 & 0x40) == 0) {
          set_sgb_attr_block(e,0,0,bVar19 - 1,0x11,bVar20);
          set_sgb_attr_block(e,uVar31,0,(uint)bVar19,0x11,bVar30);
          x0 = iVar37;
          iVar37 = 0;
        }
        else {
          set_sgb_attr_block(e,0,0,0x13,bVar19 - 1,bVar20);
          set_sgb_attr_block(e,0,uVar31,0x13,uVar31,bVar30);
          x0 = 0;
        }
        set_sgb_attr_block(e,x0,iVar37,0x13,0x11,bVar10 & 3);
        break;
      case 7:
        uVar15 = (uint)(e->state).sgb.data[1];
        bVar10 = (e->state).sgb.data[2];
        bVar39 = (e->state).sgb.data[5] == '\0';
        uVar31 = (uint)(e->state).sgb.packet_count * 0x40 - 0x18;
        uVar16 = (uint)*(ushort *)((e->state).sgb.data + 3);
        if ((int)uVar16 < (int)uVar31) {
          uVar31 = uVar16;
        }
        uVar16 = 0x168;
        if ((int)uVar31 < 0x168) {
          uVar16 = uVar31;
        }
        uVar17 = 4;
        if ((int)uVar31 < 4) {
          uVar17 = uVar31;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        for (uVar24 = 0; (long)uVar24 < (long)(int)uVar16; uVar24 = uVar24 + 4) {
          bVar19 = (e->state).sgb.data[(uVar24 >> 2) + 6];
          for (iVar37 = 6; uVar17 * 2 + iVar37 != 6; iVar37 = iVar37 + -2) {
            uVar31 = uVar15 + bVar39;
            bVar20 = (byte)uVar31;
            bVar30 = (bVar10 + !bVar39 + '\x01') - (bVar20 < 0x14);
            uVar31 = uVar31 & 0xff;
            if (0x13 < bVar20) {
              uVar31 = 0;
            }
            set_sgb_attr_block(e,uVar15,(uint)bVar10,uVar15,(uint)bVar10,
                               bVar19 >> ((byte)iVar37 & 0x1f));
            uVar28 = uVar31 + 1 & 0xff;
            if (0x12 < (byte)uVar31) {
              uVar28 = 0;
            }
            uVar15 = uVar31;
            bVar10 = bVar30;
            if (0x11 < bVar30) {
              uVar15 = uVar28;
              bVar10 = 0;
            }
          }
        }
        break;
      case 10:
        unpack_sgb_palette_ram(e,3,(e->state).sgb.data[7],(e->state).sgb.data[8]);
        unpack_sgb_palette_ram(e,2,(e->state).sgb.data[5],(e->state).sgb.data[6]);
        unpack_sgb_palette_ram(e,1,(e->state).sgb.data[3],(e->state).sgb.data[4]);
        unpack_sgb_palette_ram(e,0,(e->state).sgb.data[1],(e->state).sgb.data[2]);
        bVar10 = (e->state).sgb.data[9];
        if (-1 < (char)bVar10) break;
        bVar10 = bVar10 & 0x7f;
        goto LAB_00107134;
      case 0xb:
        puVar32 = (e->state).sgb.pal_ram;
        goto LAB_001070af;
      case 0x11:
        (e->state).sgb.player_mask = (e->state).sgb.data[1] & 3;
        break;
      case 0x13:
        puVar32 = pSVar2->chr_ram + (((e->state).sgb.data[1] & 1) << 0xc);
LAB_001070af:
        __n = 0x1000;
LAB_001070b4:
        memcpy(puVar32,local_78,__n);
        break;
      case 0x14:
        pRVar35 = (e->state).sgb.border_pal[0] + 1;
        puVar32 = local_78 + 0x803;
        for (lVar34 = 0; lVar34 != 4; lVar34 = lVar34 + 1) {
          (e->state).sgb.border_pal[lVar34][0] = 0;
          for (lVar26 = 0; lVar26 != 0xf; lVar26 = lVar26 + 1) {
            RVar13 = unpack_cgb_color8(e,puVar32[lVar26 * 2 + -1],puVar32[lVar26 * 2]);
            pRVar35[lVar26] = RVar13;
          }
          pRVar35 = pRVar35 + 0x10;
          puVar32 = puVar32 + 0x20;
        }
        local_40 = e->sgb_frame_buffer;
        for (lVar34 = 0; lVar34 != 0x1c; lVar34 = lVar34 + 1) {
          pRVar35 = local_40;
          for (lVar26 = 0; lVar26 != 0x20; lVar26 = lVar26 + 1) {
            lVar27 = lVar34 * 0x40 + lVar26 * 2;
            bVar10 = local_78[lVar27 + 1];
            pSVar8 = (SGB *)((e->state).sgb.chr_ram + 0xe);
            if (-1 < (char)bVar10) {
              pSVar8 = pSVar2;
            }
            puVar32 = pSVar8->chr_ram + (ulong)local_78[lVar27] * 0x20;
            pRVar36 = pRVar35;
            for (lVar27 = 0; lVar27 != 8; lVar27 = lVar27 + 1) {
              bVar19 = *puVar32;
              bVar20 = puVar32[1];
              bVar30 = puVar32[0x10];
              bVar22 = puVar32[0x11];
              if ((bVar10 & 0x40) == 0) {
                bVar19 = bVar19 << 4 | bVar19 >> 4;
                bVar19 = bVar19 >> 2 & 0x33 | (bVar19 & 0x33) << 2;
                bVar19 = bVar19 >> 1 & 0x55 | (bVar19 & 0x55) * '\x02';
                bVar20 = bVar20 << 4 | bVar20 >> 4;
                bVar20 = bVar20 >> 2 & 0x33 | (bVar20 & 0x33) << 2;
                bVar20 = bVar20 >> 1 & 0x55 | (bVar20 & 0x55) * '\x02';
                bVar30 = bVar30 << 4 | bVar30 >> 4;
                bVar30 = bVar30 >> 2 & 0x33 | (bVar30 & 0x33) << 2;
                bVar30 = bVar30 >> 1 & 0x55 | (bVar30 & 0x55) * '\x02';
                bVar22 = bVar22 << 4 | bVar22 >> 4;
                bVar22 = bVar22 >> 2 & 0x33 | (bVar22 & 0x33) << 2;
                bVar22 = bVar22 >> 1 & 0x55 | (bVar22 & 0x55) * '\x02';
              }
              uVar24 = (ulong)bVar22;
              for (lVar38 = 0; lVar38 != 8; lVar38 = lVar38 + 1) {
                pRVar36[lVar38] =
                     *(RGBA *)((long)(e->state).sgb.border_pal[0] +
                              (ulong)((uint)(bVar19 & 1) + (bVar20 & 1) * 2 + (bVar30 & 1) * 4 +
                                     ((uint)uVar24 & 1) * 8) * 4 + (ulong)((bVar10 >> 2 & 3) << 6));
                bVar19 = bVar19 >> 1;
                bVar20 = bVar20 >> 1;
                bVar30 = bVar30 >> 1;
                uVar24 = uVar24 >> 1;
              }
              puVar32 = puVar32 + (ulong)(-1 < (char)bVar10) * 4 + -2;
              pRVar36 = pRVar36 + 0x100;
            }
            pRVar35 = pRVar35 + 8;
          }
          local_40 = local_40 + 0x800;
        }
        goto LAB_0010709b;
      case 0x15:
        puVar32 = (e->state).sgb.attr_ram;
        __n = 0xfd2;
        goto LAB_001070b4;
      case 0x16:
        bVar10 = (e->state).sgb.data[1];
LAB_00107134:
        set_sgb_attr(e,bVar10);
        break;
      case 0x17:
        SVar18 = (SgbMask)(e->state).sgb.data[1];
        if (SGB_MASK_COLOR0 < SVar18) break;
        (e->state).sgb.mask = SVar18;
LAB_0010709b:
        update_sgb_mask(e);
      }
switchD_00106952_caseD_8:
      check_joyp_intr(e);
      return;
    case 1:
      serial_synchronize(e);
      (e->state).serial.sb = value;
      break;
    case 2:
      serial_synchronize(e);
      (e->state).serial.transferring = (uint)(value >> 7);
      (e->state).serial.clock = value & SERIAL_CLOCK_INTERNAL;
      if ((char)value < '\0') {
        (e->state).serial.tick_count = 0;
        (e->state).serial.transferred_bits = '\0';
      }
      calculate_next_serial_intr(e);
      return;
    case 3:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      break;
    case 4:
      timer_synchronize(e);
      if (((e->state).timer.on != FALSE) &&
         (((e->state).timer.div_counter & s_tima_mask[(e->state).timer.clock_select]) != 0)) {
        increment_tima(e);
      }
      (e->state).timer.div_counter = 0;
      goto LAB_001065ad;
    case 5:
      timer_synchronize(e);
      if ((e->state).timer.on == FALSE) {
        (e->state).timer.tima = value;
        return;
      }
      TVar7 = (e->state).timer.tima_state;
      if (TVar7 == TIMA_STATE_RESET) goto LAB_001065ad;
      if (TVar7 == TIMA_STATE_OVERFLOW) {
        (e->state).timer.tima_state = TIMA_STATE_NORMAL;
        puVar32 = &(e->state).interrupt.new_if;
        *puVar32 = *puVar32 & 0xfb;
      }
      goto LAB_00106471;
    case 6:
      timer_synchronize(e);
      (e->state).timer.tma = value;
      if (((e->state).timer.on == FALSE) || ((e->state).timer.tima_state != TIMA_STATE_RESET))
      goto LAB_001065ad;
LAB_00106471:
      (e->state).timer.tima = value;
LAB_001065ad:
      calculate_next_timer_intr(e);
      return;
    case 7:
      timer_synchronize(e);
      uVar3 = s_tima_mask[(e->state).timer.clock_select];
      (e->state).timer.clock_select = value & TIMER_CLOCK_16384_HZ;
      BVar14 = (e->state).timer.on;
      (e->state).timer.on = value >> 2 & TRUE;
      if (BVar14 == FALSE) {
        if ((value >> 2 & 1) == 0) {
          uVar4 = (e->state).timer.div_counter;
          if (((uVar4 & uVar3) == 0) || ((uVar4 & s_tima_mask[value & TIMER_CLOCK_16384_HZ]) != 0))
          goto LAB_001065ad;
        }
        else if (((e->state).timer.div_counter & uVar3) == 0) goto LAB_001065ad;
        increment_tima(e);
      }
      goto LAB_001065ad;
    case 0xf:
      intr_synchronize(e);
      (e->state).interrupt.if_ = value & 0x1f;
      (e->state).interrupt.new_if = value & 0x1f;
      break;
    default:
      if (iVar37 == 0xff) {
        (e->state).interrupt.ie = value;
      }
    }
  }
  return;
}

Assistant:

static void write_io(Emulator* e, MaskedAddress addr, u8 value) {
  HOOK(write_io_asb, addr, get_io_reg_string(addr), value);
  switch (addr) {
    case IO_JOYP_ADDR:
      JOYP.joypad_select = UNPACK(value, JOYP_JOYPAD_SELECT);
      do_sgb(e);
      check_joyp_intr(e);
      break;
    case IO_SB_ADDR:
      serial_synchronize(e);
      SERIAL.sb = value;
#if RGBDS_LIVE
      EM_ASM({emulator.serialCallback($0);}, value);
#endif
      break;
    case IO_SC_ADDR:
      serial_synchronize(e);
      SERIAL.transferring = UNPACK(value, SC_TRANSFER_START);
      SERIAL.clock = UNPACK(value, SC_SHIFT_CLOCK);
      if (SERIAL.transferring) {
        SERIAL.tick_count = 0;
        SERIAL.transferred_bits = 0;
      }
      calculate_next_serial_intr(e);
      break;
    case IO_DIV_ADDR:
      timer_synchronize(e);
      clear_div(e);
      calculate_next_timer_intr(e);
      break;
    case IO_TIMA_ADDR:
      timer_synchronize(e);
      if (TIMER.on) {
        if (UNLIKELY(TIMER.tima_state == TIMA_STATE_OVERFLOW)) {
          /* Cancel the overflow and interrupt if written on the same tick. */
          TIMER.tima_state = TIMA_STATE_NORMAL;
          INTR.new_if &= ~IF_TIMER;
          TIMER.tima = value;
        } else if (TIMER.tima_state != TIMA_STATE_RESET) {
          /* Only update tima if it wasn't reset this tick. */
          TIMER.tima = value;
        }
        calculate_next_timer_intr(e);
      } else {
        TIMER.tima = value;
      }
      break;
    case IO_TMA_ADDR:
      timer_synchronize(e);
      TIMER.tma = value;
      if (UNLIKELY(TIMER.on && TIMER.tima_state == TIMA_STATE_RESET)) {
        TIMER.tima = value;
      }
      calculate_next_timer_intr(e);
      break;
    case IO_TAC_ADDR: {
      timer_synchronize(e);
      Bool old_timer_on = TIMER.on;
      u16 old_tima_mask = s_tima_mask[TIMER.clock_select];
      TIMER.clock_select = UNPACK(value, TAC_CLOCK_SELECT);
      TIMER.on = UNPACK(value, TAC_TIMER_ON);
      /* tima is incremented when a specific bit of div_counter transitions
       * from 1 to 0. This can happen as a result of writing to DIV, or in this
       * case modifying which bit we're looking at. */
      Bool tima_tick = FALSE;
      if (!old_timer_on) {
        u16 tima_mask = s_tima_mask[TIMER.clock_select];
        if (TIMER.on) {
          tima_tick = (TIMER.div_counter & old_tima_mask) != 0;
        } else {
          tima_tick = (TIMER.div_counter & old_tima_mask) != 0 &&
                      (TIMER.div_counter & tima_mask) == 0;
        }
        if (tima_tick) {
          increment_tima(e);
        }
      }
      calculate_next_timer_intr(e);
      break;
    }
    case IO_IF_ADDR:
      intr_synchronize(e);
      INTR.new_if = INTR.if_ = value & IF_ALL;
      break;
    case IO_LCDC_ADDR: {
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      Bool was_enabled = LCDC.display;
      LCDC.display = UNPACK(value, LCDC_DISPLAY);
      LCDC.window_tile_map_select = UNPACK(value, LCDC_WINDOW_TILE_MAP_SELECT);
      LCDC.window_display = UNPACK(value, LCDC_WINDOW_DISPLAY);
      LCDC.bg_tile_data_select = UNPACK(value, LCDC_BG_TILE_DATA_SELECT);
      LCDC.bg_tile_map_select = UNPACK(value, LCDC_BG_TILE_MAP_SELECT);
      LCDC.obj_size = UNPACK(value, LCDC_OBJ_SIZE);
      LCDC.obj_display = UNPACK(value, LCDC_OBJ_DISPLAY);
      LCDC.bg_display = UNPACK(value, LCDC_BG_DISPLAY);
      if (was_enabled ^ LCDC.display) {
        STAT.mode = PPU_MODE_HBLANK;
        PPU.ly = PPU.line_y = 0;
        if (LCDC.display) {
          check_ly_eq_lyc(e, FALSE);
          HOOK0(enable_display_v);
          PPU.state = PPU_STATE_LCD_ON_MODE2;
          PPU.state_ticks = PPU_MODE2_TICKS;
          PPU.line_start_ticks =
              ALIGN_UP(TICKS - CPU_TICK - CPU_TICK, CPU_TICK);
          PPU.display_delay_frames = PPU_ENABLE_DISPLAY_DELAY_FRAMES;
          STAT.trigger_mode = PPU_MODE_MODE2;
        } else {
          HOOK0(disable_display_v);
          /* Clear the framebuffer. */
          if (IS_SGB) {
            update_sgb_mask(e);
          } else {
            clear_frame_buffer(e, RGBA_WHITE);
          }
          e->state.event |= EMULATOR_EVENT_NEW_FRAME;
        }
        calculate_next_ppu_intr(e);
      }
      break;
    }
    case IO_STAT_ADDR: {
      ppu_synchronize(e);
      Bool new_vblank_irq = UNPACK(value, STAT_VBLANK_INTR);
      Bool new_hblank_irq = UNPACK(value, STAT_HBLANK_INTR);
      if (LCDC.display) {
        Bool hblank = TRIGGER_MODE_IS(HBLANK) && !STAT.hblank.irq;
        Bool vblank = TRIGGER_MODE_IS(VBLANK) && !STAT.vblank.irq;
        Bool y_compare = STAT.new_ly_eq_lyc && !STAT.y_compare.irq;
        if (IS_CGB) {
          /* CGB only triggers on STAT write if the value being written
           * actually sets that IRQ */
          hblank = hblank && new_hblank_irq;
          vblank = vblank && new_vblank_irq;
        }
        if (!STAT.if_ && (hblank || vblank || y_compare)) {
          HOOK(trigger_stat_from_write_cccii, y_compare ? 'Y' : '.',
               vblank ? 'V' : '.', hblank ? 'H' : '.', PPU.ly,
               TICKS + CPU_TICK);
          INTR.new_if |= IF_STAT;
          INTR.if_ |= IF_STAT;
          STAT.if_ = TRUE;
        }
      }
      STAT.y_compare.irq = UNPACK(value, STAT_YCOMPARE_INTR);
      STAT.mode2.irq = UNPACK(value, STAT_MODE2_INTR);
      STAT.vblank.irq = new_vblank_irq;
      STAT.hblank.irq = new_hblank_irq;
      calculate_next_ppu_intr(e);
      break;
    }
    case IO_SCY_ADDR:
      ppu_mode3_synchronize(e);
      PPU.scy = value;
      break;
    case IO_SCX_ADDR:
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      PPU.scx = value;
      break;
    case IO_LY_ADDR:
      break;
    case IO_LYC_ADDR:
      ppu_synchronize(e);
      PPU.lyc = value;
      if (LCDC.display) {
        check_ly_eq_lyc(e, TRUE);
        check_stat(e);
      }
      calculate_next_ppu_intr(e);
      break;
    case IO_DMA_ADDR:
      /* DMA can be restarted. */
      dma_synchronize(e);
      DMA.sync_ticks = TICKS;
      DMA.tick_count = 0;
      DMA.state = (DMA.state != DMA_INACTIVE ? DMA.state : DMA_TRIGGERED);
      DMA.source = value << 8;
      break;
    case IO_BGP_ADDR:
    case IO_OBP0_ADDR:
    case IO_OBP1_ADDR: {
      PaletteType type = addr - IO_BGP_ADDR;
      Palette* pal = &PPU.pal[type];
      ppu_mode3_synchronize(e);
      pal->color[3] = UNPACK(value, PALETTE_COLOR3);
      pal->color[2] = UNPACK(value, PALETTE_COLOR2);
      pal->color[1] = UNPACK(value, PALETTE_COLOR1);
      pal->color[0] = UNPACK(value, PALETTE_COLOR0);
      update_bw_palette_rgba(e, type);
      break;
    }
    case IO_WY_ADDR:
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      PPU.wy = value;
      break;
    case IO_WX_ADDR:
      ppu_mode3_synchronize(e);
      PPU.wx = value;
      break;
    case IO_KEY1_ADDR:
      if (IS_CGB) {
        CPU_SPEED.switching = UNPACK(value, KEY1_PREPARE_SPEED_SWITCH);
      }
      break;
    case IO_VBK_ADDR:
      if (IS_CGB) {
        VRAM.bank = UNPACK(value, VBK_VRAM_BANK);
        VRAM.offset = VRAM.bank << 13;
      }
      break;
    case IO_HDMA1_ADDR:
      if (IS_CGB) {
        HDMA.source = (HDMA.source & 0x00ff) | (value << 8);
      }
      break;
    case IO_HDMA2_ADDR:
      if (IS_CGB) {
        HDMA.source = (HDMA.source & 0xff00) | (value & 0xf0);
      }
      break;
    case IO_HDMA3_ADDR:
      if (IS_CGB) {
        HDMA.dest = (HDMA.dest & 0x00ff) | (value << 8);
      }
      break;
    case IO_HDMA4_ADDR:
      if (IS_CGB) {
        HDMA.dest = (HDMA.dest & 0xff00) | (value & 0xf0);
      }
      break;
    case IO_HDMA5_ADDR:
      if (IS_CGB) {
        HdmaTransferMode new_mode = UNPACK(value, HDMA5_TRANSFER_MODE);
        u8 new_blocks = UNPACK(value, HDMA5_BLOCKS);
        if (HDMA.mode == HDMA_TRANSFER_MODE_HDMA &&
            (HDMA.blocks & 0x80) == 0) { /* HDMA Active */
          if (new_mode == HDMA_TRANSFER_MODE_GDMA) {
            /* Stop HDMA copy. */
            HDMA.blocks |= 0x80 | new_blocks;
          } else {
            HDMA.blocks = new_blocks;
            HDMA.mode = new_mode;
          }
        } else {
          HDMA.mode = new_mode;
          HDMA.blocks = new_blocks;
        }
        if (HDMA.mode == HDMA_TRANSFER_MODE_GDMA) {
          HDMA.state = DMA_ACTIVE;
        }
      }
      break;
    case IO_RP_ADDR:
      if (IS_CGB) {
        INFRARED.write = UNPACK(value, RP_WRITE_DATA);
        INFRARED.enabled = UNPACK(value, RP_DATA_READ_ENABLE);
      }
      break;
    case IO_BCPS_ADDR:
    case IO_OCPS_ADDR:
      if (IS_CGB) {
        ppu_mode3_synchronize(e);
        ColorPalettes* cp = addr == IO_BCPS_ADDR ? &PPU.bgcp : &PPU.obcp;
        cp->index = UNPACK(value, XCPS_INDEX);
        cp->auto_increment = UNPACK(value, XCPS_AUTO_INCREMENT);
      }
      break;
    case IO_BCPD_ADDR:
    case IO_OCPD_ADDR:
      if (IS_CGB) {
        ppu_mode3_synchronize(e);
        ColorPalettes* cp = addr == IO_BCPD_ADDR ? &PPU.bgcp : &PPU.obcp;
        cp->data[cp->index] = value;
        u8 palette_index = (cp->index >> 3) & 7;
        u8 color_index = (cp->index >> 1) & 3;
        u16 color16 = (cp->data[cp->index | 1] << 8) | cp->data[cp->index & ~1];
        RGBA color = unpack_cgb_color(e, color16);
        cp->palettes[palette_index].color[color_index] = color;
        if (cp->auto_increment) {
          cp->index = (cp->index + 1) & 0x3f;
        }
      }
      break;
    case IO_SVBK_ADDR:
      if (IS_CGB) {
        WRAM.bank = UNPACK(value, SVBK_WRAM_BANK);
        WRAM.offset = WRAM.bank == 0 ? 0x1000 : (WRAM.bank << 12);
      }
      break;
    case IO_IE_ADDR:
      INTR.ie = value;
      break;
    default:
      HOOK(write_io_ignored_as, addr, get_io_reg_string(addr), value);
      break;
  }
}